

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<kj::HashMap<int,_kj::String>::Entry>::setCapacity
          (Vector<kj::HashMap<int,_kj::String>::Entry> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<kj::StringPtr> *pAVar2;
  size_t __length;
  size_t extraout_RDX;
  size_t size;
  undefined1 local_38 [8];
  ArrayBuilder<kj::StringPtr> newBuilder;
  size_t newSize_local;
  Vector<kj::StringPtr> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)
           ArrayBuilder<kj::HashMap<int,_kj::String>::Entry>::size
                     ((ArrayBuilder<kj::HashMap<int,_kj::String>::Entry> *)this);
  size = __length;
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<kj::HashMap<int,_kj::String>::Entry>::truncate
              ((ArrayBuilder<kj::HashMap<int,_kj::String>::Entry> *)this,(char *)newBuilder.disposer
               ,__length);
    size = extraout_RDX;
  }
  heapArrayBuilder<kj::HashMap<int,kj::String>::Entry>
            ((ArrayBuilder<kj::StringPtr> *)local_38,(kj *)newBuilder.disposer,size);
  pAVar2 = mv<kj::ArrayBuilder<kj::HashMap<int,kj::String>::Entry>>
                     ((ArrayBuilder<kj::StringPtr> *)this);
  ArrayBuilder<kj::HashMap<int,kj::String>::Entry>::
  addAll<kj::ArrayBuilder<kj::HashMap<int,kj::String>::Entry>>
            ((ArrayBuilder<kj::HashMap<int,kj::String>::Entry> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<kj::HashMap<int,kj::String>::Entry>>
                     ((ArrayBuilder<kj::StringPtr> *)local_38);
  ArrayBuilder<kj::HashMap<int,_kj::String>::Entry>::operator=
            ((ArrayBuilder<kj::HashMap<int,_kj::String>::Entry> *)this,pAVar2);
  ArrayBuilder<kj::HashMap<int,_kj::String>::Entry>::~ArrayBuilder
            ((ArrayBuilder<kj::HashMap<int,_kj::String>::Entry> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }